

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void init_beam(void)

{
  double dVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  reference pvVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 in_XMM5_Qa;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double in_stack_000000a0;
  double in_stack_000000a8;
  double in_stack_000000b0;
  double in_stack_000000b8;
  double in_stack_000000c0;
  int i;
  double in_stack_000000c8;
  double in_stack_000000d0;
  double in_stack_000000d8;
  spatial_region *in_stack_000000e0;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  
  iVar3 = mpi_rank;
  bVar4 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if (bVar4) {
    std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
              ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x14635c);
    sqrt((epsb * epsb) / 0.261121 - 1.0);
    dVar2 = dx;
    dVar1 = xlength - x0b;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)iVar3);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar1;
    auVar9._0_8_ = (double)*pvVar5;
    auVar9._8_8_ = in_XMM5_Qa;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = -dVar2;
    vfmadd213sd_fma(auVar9,auVar6,auVar12);
    spatial_region::add_beam
              (in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
               in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
               in_stack_000000a0);
  }
  else {
    bVar4 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if (bVar4) {
      std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x14652c);
      dVar2 = dx;
      dVar1 = xlength - x0b;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)iVar3);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dVar1;
      auVar10._0_8_ = (double)*pvVar5;
      auVar10._8_8_ = in_XMM5_Qa;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = -dVar2;
      vfmadd213sd_fma(auVar10,auVar7,auVar13);
      spatial_region::add_beam
                (in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
                 in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
                 in_stack_000000a0);
    }
    else {
      std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x14664c);
      sqrt((epsb * epsb) / 0.261121 - 1.0);
      dVar2 = dx;
      dVar1 = xlength - x0b;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)iVar3);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar1;
      auVar11._0_8_ = (double)*pvVar5;
      auVar11._8_8_ = in_XMM5_Qa;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = -dVar2;
      vfmadd213sd_fma(auVar11,auVar8,auVar14);
      spatial_region::add_beam
                (in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
                 in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
                 in_stack_000000a0);
    }
  }
  return;
}

Assistant:

void init_beam()
{
    int i = mpi_rank;
    if (beam_particles=="p")
        psr->add_beam(1,Nb*1.061e-11/(xb*rb*rb*lambda),((epsb>0)-(epsb<0))*sqrt(epsb*epsb/(0.511*0.511)-1),xb,rb,xlength-x0b-dx*x0_sr[i],y0b,phib);
    else if (beam_particles=="ph")
        psr->add_beam(0,Nb*1.061e-11/(xb*rb*rb*lambda),epsb/0.511,xb,rb,xlength-x0b-dx*x0_sr[i],y0b,phib);
    else
        psr->add_beam(-1,Nb*1.061e-11/(xb*rb*rb*lambda),((epsb>0)-(epsb<0))*sqrt(epsb*epsb/(0.511*0.511)-1),xb,rb,xlength-x0b-dx*x0_sr[i],y0b,phib);
}